

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidityTests.cpp
# Opt level: O0

bool ValidityTests::nearlyEqual(double a,double b,double epsilon)

{
  double dVar1;
  double diff;
  double absB;
  double absA;
  double epsilon_local;
  double b_local;
  double a_local;
  
  if ((a != b) || (NAN(a) || NAN(b))) {
    if (((a == 0.0) && (!NAN(a))) ||
       (((b == 0.0 && (!NAN(b))) || (ABS(a) + ABS(b) < 2.2250738585072014e-308)))) {
      a_local._7_1_ = ABS(a - b) < epsilon * 2.2250738585072014e-308;
    }
    else {
      dVar1 = ABS(a) + ABS(b);
      if (1.79769313486232e+308 <= dVar1) {
        dVar1 = 1.79769313486232e+308;
      }
      a_local._7_1_ = ABS(a - b) / dVar1 < epsilon;
    }
  }
  else {
    a_local._7_1_ = true;
  }
  return a_local._7_1_;
}

Assistant:

bool ValidityTests::nearlyEqual(double a, double b, double epsilon) {
  // Handles cases of equality statements for floats
  if (a == b) {  // shortcut, handles infinities
    return true;
  }
  double absA = fabs(a);
  double absB = fabs(b);
  double diff = fabs(a - b);

  if (a == 0 || b == 0 || (absA + absB < DBL_MIN)) {
    // a or b is zero or both are extremely close to it
    // relative error is less meaningful here
    return diff < (epsilon * DBL_MIN);
  }  // use relative error
  return diff / fmin((absA + absB), DBL_MAX) < epsilon;
}